

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O2

Expression * __thiscall
soul::StructuralParser::parseVectorOrArrayTypeSuffixes
          (StructuralParser *this,Expression *elementType,ParseTypeContext parseContext)

{
  char *pcVar1;
  bool bVar2;
  Expression *args_2;
  SubscriptWithChevrons *t;
  pool_ptr<soul::AST::Expression> size;
  Context context;
  undefined1 local_80 [32];
  UTF8Reader local_60;
  CompileMessage local_58;
  
  getContext((Context *)(local_80 + 8),this);
  pcVar1 = (this->super_SOULTokeniser).location.location.data;
  bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2a352e);
  if (bVar2) {
    this->ignoreGreaterThanToken = this->ignoreGreaterThanToken + 1;
    tryToParseExpressionIgnoringErrors((StructuralParser *)local_80);
    this->ignoreGreaterThanToken = this->ignoreGreaterThanToken + -1;
    if (((Expression *)local_80._0_8_ == (Expression *)0x0) ||
       (bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2c92c0), !bVar2))
    {
      local_60.data = pcVar1;
      Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
      ::resetPosition(&this->super_SOULTokeniser,&local_60);
    }
    else {
      bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
              ::matches(&this->super_SOULTokeniser,(TokenType)0x2a352e);
      if (bVar2) {
        Errors::wrongTypeForVectorElement<>();
        (*(this->super_SOULTokeniser)._vptr_Tokeniser[2])(this,&local_58);
        CompileMessage::~CompileMessage(&local_58);
      }
      args_2 = pool_ptr<soul::AST::Expression>::operator*
                         ((pool_ptr<soul::AST::Expression> *)local_80);
      t = allocate<soul::AST::SubscriptWithChevrons,soul::AST::Context&,soul::AST::Expression&,soul::AST::Expression&>
                    (this,(Context *)(local_80 + 8),elementType,args_2);
      elementType = parseArrayTypeSuffixes(this,&t->super_Expression,parseContext);
    }
  }
  else {
    elementType = parseArrayTypeSuffixes(this,elementType,parseContext);
  }
  RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr
            ((RefCountedPtr<soul::SourceCodeText> *)(local_80 + 8));
  return elementType;
}

Assistant:

AST::Expression& parseVectorOrArrayTypeSuffixes (AST::Expression& elementType, ParseTypeContext parseContext)
    {
        auto context = getContext();
        auto startPos = getCurrentTokeniserPosition();

        if (! matchIf (Operator::lessThan))
            return parseArrayTypeSuffixes (elementType, parseContext);

        ++ignoreGreaterThanToken;
        auto size = tryToParseExpressionIgnoringErrors();
        --ignoreGreaterThanToken;

        if (size == nullptr || ! matchIf (Operator::greaterThan))
        {
            resetPosition (startPos);
            return elementType;
        }

        if (matches (Operator::lessThan))
            throwError (Errors::wrongTypeForVectorElement());

        auto& e = allocate<AST::SubscriptWithChevrons> (context, elementType, *size);
        return parseArrayTypeSuffixes (e, parseContext);
    }